

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_type(lysp_yang_ctx *ctx,lysp_type *type)

{
  uint8_t *puVar1;
  lysp_type *plVar2;
  ushort uVar3;
  LY_ERR LVar4;
  long *plVar5;
  lysp_restr *plVar6;
  char *format;
  size_t *word_len_00;
  long lVar7;
  ly_ctx *plVar8;
  ly_stmt stmt;
  char *pcVar9;
  lysp_ext_instance **exts;
  LY_ERR ret__;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *str_path;
  char *buf;
  undefined2 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff62;
  undefined4 in_stack_ffffffffffffff64;
  ly_stmt local_84;
  char *local_80;
  size_t local_78;
  lysp_ext_instance **local_70;
  char *local_68;
  lyxp_expr **local_60;
  char ***local_58;
  lysp_type_enum **local_50;
  lysp_type_enum **local_48;
  lysp_restr **local_40;
  lysp_ext_instance *local_38;
  
  local_68 = (char *)0x0;
  if (type->name != (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Duplicate keyword \"%s\".";
    pcVar9 = "type";
LAB_0017342d:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar9);
    return LY_EVALID;
  }
  exts = &local_38;
  LVar4 = get_argument(ctx,Y_PREF_IDENTIF_ARG,(uint16_t *)0x0,&local_80,(char **)exts,&local_78);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (local_38 == (lysp_ext_instance *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar9 = local_80;
    if (local_78 == 0) {
      pcVar9 = "";
    }
    LVar4 = lydict_insert(plVar8,pcVar9,local_78,&type->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar4 = lydict_insert_zc(plVar8,local_80,&type->name);
  }
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  type->pmod = (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  LVar4 = get_keyword(ctx,&local_84,&local_80,&local_78);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (local_84 == LY_STMT_SYNTAX_SEMICOLON) {
    return LY_SUCCESS;
  }
  if (local_84 != LY_STMT_SYNTAX_LEFT_BRACE) {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    pcVar9 = lyplg_ext_stmt2str(local_84);
    format = "Invalid keyword \"%s\", expected \";\" or \"{\".";
    goto LAB_0017342d;
  }
  word_len_00 = &local_78;
  LVar4 = get_keyword(ctx,&local_84,&local_80,word_len_00);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (local_84 == LY_STMT_SYNTAX_RIGHT_BRACE) {
    return LY_SUCCESS;
  }
  local_70 = &type->exts;
  local_40 = &type->patterns;
  local_60 = &type->path;
  local_48 = &type->enums;
  local_50 = &type->bits;
  local_58 = &type->bases;
LAB_00173560:
  if ((int)local_84 < 0x170000) {
    if ((int)local_84 < 0xb0000) {
      if (local_84 == LY_STMT_BASE) {
        LVar4 = parse_text_fields(ctx,(ly_stmt)local_58,(char ***)local_70,(yang_arg)word_len_00,
                                  exts);
        uVar3 = 1;
      }
      else {
        if (local_84 != LY_STMT_BIT) {
LAB_0017394a:
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          pcVar9 = lyplg_ext_stmt2str(local_84);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar9,"type");
          return LY_EVALID;
        }
        LVar4 = parse_type_enum(ctx,LY_STMT_BIT,local_50);
        uVar3 = 2;
      }
    }
    else if (local_84 == LY_STMT_ENUM) {
      LVar4 = parse_type_enum(ctx,LY_STMT_ENUM,local_48);
      uVar3 = 4;
    }
    else {
      if (local_84 == LY_STMT_EXTENSION_INSTANCE) {
        exts = (lysp_ext_instance **)0x2e0000;
        LVar4 = parse_ext(ctx,local_80,local_78,type,LY_STMT_TYPE,0,local_70);
        goto LAB_0017379b;
      }
      if (local_84 != LY_STMT_FRACTION_DIGITS) goto LAB_0017394a;
      LVar4 = parse_type_fracdigits(ctx,type);
      uVar3 = 8;
    }
  }
  else {
    if (0x25ffff < (int)local_84) {
      if (local_84 == LY_STMT_RANGE) {
        if (type->range != (lysp_restr *)0x0) {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          stmt = LY_STMT_RANGE;
          goto LAB_001739e5;
        }
        plVar6 = (lysp_restr *)calloc(1,0x40);
        type->range = plVar6;
        if (plVar6 == (lysp_restr *)0x0) goto LAB_00173a0b;
        LVar4 = parse_restr(ctx,LY_STMT_RANGE,plVar6);
        uVar3 = 0x80;
        goto LAB_001738ad;
      }
      if (local_84 != LY_STMT_REQUIRE_INSTANCE) {
        if (local_84 != LY_STMT_TYPE) goto LAB_0017394a;
        plVar2 = type->types;
        if (plVar2 == (lysp_type *)0x0) {
          plVar5 = (long *)malloc(0x70);
          if (plVar5 == (long *)0x0) goto LAB_00173a0b;
          *plVar5 = 1;
          lVar7 = 1;
        }
        else {
          lVar7 = *(long *)&plVar2[-1].fraction_digits;
          *(long *)&plVar2[-1].fraction_digits = lVar7 + 1;
          plVar5 = (long *)realloc(&plVar2[-1].fraction_digits,lVar7 * 0x68 + 0x70);
          if (plVar5 == (long *)0x0) {
            puVar1 = &type->types[-1].fraction_digits;
            *(long *)puVar1 = *(long *)puVar1 + -1;
LAB_00173a0b:
            ly_log((ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                   LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type");
            return LY_EMEM;
          }
          lVar7 = *plVar5;
        }
        type->types = (lysp_type *)(plVar5 + 1);
        plVar5 = plVar5 + lVar7 * 0xd;
        plVar5[-2] = 0;
        plVar5[-1] = 0;
        plVar5[-4] = 0;
        plVar5[-3] = 0;
        plVar5[-6] = 0;
        plVar5[-5] = 0;
        plVar5[-8] = 0;
        plVar5[-7] = 0;
        plVar5[-10] = 0;
        plVar5[-9] = 0;
        ((lysp_type *)(plVar5 + -0xc))->name = (char *)0x0;
        plVar5[-0xb] = 0;
        *plVar5 = 0;
        LVar4 = parse_type(ctx,(lysp_type *)(plVar5 + -0xc));
        uVar3 = 0x100;
        goto LAB_001738ad;
      }
      LVar4 = parse_type_reqinstance(ctx,type);
LAB_0017379b:
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      goto LAB_001738bb;
    }
    if (local_84 == LY_STMT_LENGTH) {
      if (type->length == (lysp_restr *)0x0) {
        plVar6 = (lysp_restr *)calloc(1,0x40);
        type->length = plVar6;
        if (plVar6 == (lysp_restr *)0x0) goto LAB_00173a0b;
        LVar4 = parse_restr(ctx,LY_STMT_LENGTH,plVar6);
        uVar3 = 0x10;
        goto LAB_001738ad;
      }
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      stmt = LY_STMT_LENGTH;
LAB_001739e5:
      pcVar9 = lyplg_ext_stmt2str(stmt);
      format = "Duplicate keyword \"%s\".";
      goto LAB_0017342d;
    }
    if (local_84 == LY_STMT_PATH) {
      if (*local_60 != (lyxp_expr *)0x0) {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        stmt = LY_STMT_PATH;
        goto LAB_001739e5;
      }
      LVar4 = parse_text_field(ctx,type,LY_STMT_PATH,(uint32_t)&local_68,(char **)0x2,Y_IDENTIF_ARG,
                               (uint16_t *)local_70,
                               (lysp_ext_instance **)
                               CONCAT44(in_stack_ffffffffffffff64,
                                        CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60
                                                )));
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      if (LVar4 != LY_SUCCESS) {
        lydict_remove(plVar8,local_68);
        return LVar4;
      }
      in_stack_ffffffffffffff60 = 0x400;
      in_stack_ffffffffffffff62 = 0;
      exts = (lysp_ext_instance **)0x1;
      LVar4 = ly_path_parse(plVar8,(lysc_node *)0x0,local_68,0,'\x01',2,0x10,0x400,local_60);
      lydict_remove((ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
                    ,local_68);
      uVar3 = 0x20;
    }
    else {
      if (local_84 != LY_STMT_PATTERN) goto LAB_0017394a;
      LVar4 = parse_type_pattern(ctx,local_40);
      uVar3 = 0x40;
    }
  }
LAB_001738ad:
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  type->flags = type->flags | uVar3;
LAB_001738bb:
  word_len_00 = &local_78;
  LVar4 = get_keyword(ctx,&local_84,&local_80,&local_78);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (local_84 == LY_STMT_SYNTAX_RIGHT_BRACE) {
    if ((*local_70 != (lysp_ext_instance *)0x0) &&
       (LVar4 = ly_set_add(&ctx->main_ctx->ext_inst,*local_70,'\x01',(uint32_t *)0x0),
       LVar4 != LY_SUCCESS)) {
      return LVar4;
    }
    return LY_SUCCESS;
  }
  goto LAB_00173560;
}

Assistant:

static LY_ERR
parse_type(struct lysp_yang_ctx *ctx, struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    const char *str_path = NULL;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_type *nest_type;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_PREF_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, type->name, word, word_len, ret, cleanup);

    /* set module */
    type->pmod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(parse_type_fracdigits(ctx, type));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            if (type->path) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(LY_STMT_PATH));
                return LY_EVALID;
            }

            /* Usually, in the parser_yang.c, the result of the parsing is stored directly in the
             * corresponding structure, so in case of failure, the lysp_module_free function will take
             * care of removing the parsed value from the dictionary. But in this case, it is not possible
             * to rely on lysp_module_free because the result of the parsing is stored in a local variable.
             */
            LY_CHECK_ERR_RET(ret = parse_text_field(ctx, type, LY_STMT_PATH, 0, &str_path, Y_STR_ARG, NULL, &type->exts),
                    lydict_remove(PARSER_CTX(ctx), str_path), ret);
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            /* Moreover, even if successful, the string is removed from the dictionary. */
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(parse_type_pattern(ctx, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(parse_type_reqinstance(ctx, type));
            /* LYS_SET_REQINST checked and set inside parse_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(parse_type(ctx, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, type, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "type");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, type->exts, ret, cleanup);
    }

cleanup:
    return ret;
}